

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acb.h
# Opt level: O0

void Acb_ObjAddFaninFanout(Acb_Ntk_t *p,int iObj)

{
  int *piVar1;
  Vec_Int_t *p_00;
  int *pFanins;
  int local_18;
  int iFanin;
  int k;
  int iObj_local;
  Acb_Ntk_t *p_local;
  
  local_18 = 0;
  piVar1 = Acb_ObjFanins(p,iObj);
  for (; local_18 < *piVar1; local_18 = local_18 + 1) {
    p_00 = Vec_WecEntry(&p->vFanouts,piVar1[local_18 + 1]);
    Vec_IntPush(p_00,iObj);
  }
  return;
}

Assistant:

static inline void Acb_ObjAddFaninFanout( Acb_Ntk_t * p, int iObj )
{
    int k, iFanin, * pFanins; 
    Acb_ObjForEachFaninFast( p, iObj, pFanins, iFanin, k )
        Vec_IntPush( Vec_WecEntry(&p->vFanouts, iFanin), iObj );
}